

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

optional<common::PSBTError> __thiscall
wallet::LegacyScriptPubKeyMan::FillPSBT
          (LegacyScriptPubKeyMan *this,PartiallySignedTransaction *psbtx,
          PrecomputedTransactionData *txdata,int sighash_type,bool sign,bool bip32derivs,
          int *n_signed,bool finalize)

{
  long lVar1;
  element_type *peVar2;
  bool bVar3;
  reference input;
  uint i;
  ulong uVar4;
  uint index;
  FillableSigningProvider *pFVar5;
  long in_FS_OFFSET;
  _Optional_payload_base<common::PSBTError> local_68;
  SigningProvider local_50;
  undefined1 local_48;
  undefined1 local_47;
  FillableSigningProvider *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (n_signed != (int *)0x0) {
    *n_signed = 0;
  }
  pFVar5 = &(this->super_LegacyDataSPKM).super_FillableSigningProvider;
  index = 0;
  local_68._M_payload = (_Storage<common::PSBTError,_true>)0x1;
  local_68._M_engaged = true;
  local_68._5_3_ = 0;
  do {
    uVar4 = (ulong)index;
    lVar1 = *(long *)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                      .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
    if ((ulong)(((long)*(pointer *)
                        ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                                _M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin + 8) - lVar1) / 0x68) <= uVar4) {
      for (uVar4 = 0;
          uVar4 < (ulong)(((long)*(pointer *)
                                  ((long)&(psbtx->tx).
                                          super__Optional_base<CMutableTransaction,_false,_false>.
                                          _M_payload.
                                          super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                          .super__Optional_payload_base<CMutableTransaction>.
                                          _M_payload._M_value.vout + 8) -
                          *(long *)&(psbtx->tx).
                                    super__Optional_base<CMutableTransaction,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                    .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                    _M_value.vout.
                                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>) / 0x28);
          uVar4 = (ulong)((int)uVar4 + 1)) {
        local_50._vptr_SigningProvider = (_func_int **)&PTR__SigningProvider_01158df0;
        local_48 = 1;
        local_47 = !bip32derivs;
        local_40 = pFVar5;
        UpdatePSBTOutput(&local_50,psbtx,(int)uVar4);
      }
      local_68._M_payload = (_Storage<common::PSBTError,_true>)0x0;
      local_68._M_engaged = false;
      local_68._5_3_ = 0;
LAB_0096c9f7:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (optional<common::PSBTError>)local_68;
    }
    input = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at(&psbtx->inputs,uVar4);
    bVar3 = PSBTInputSigned(input);
    if (!bVar3) {
      if (((sign) &&
          ((input->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_engaged == true)) &&
         ((input->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value != sighash_type)) goto LAB_0096c9f7;
      peVar2 = (input->non_witness_utxo).
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        if ((input->witness_utxo).nValue == -1) goto LAB_0096c992;
      }
      else if ((ulong)(((long)*(pointer *)
                               ((long)&(peVar2->vout).
                                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                       super__Vector_impl_data + 8) -
                       (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x28) <=
               (ulong)*(uint *)(lVar1 + 0x20 + uVar4 * 0x68)) {
        local_68._M_payload = (_Storage<common::PSBTError,_true>)0x0;
        local_68._M_engaged = true;
        local_68._5_3_ = 0;
        goto LAB_0096c9f7;
      }
      local_50._vptr_SigningProvider = (_func_int **)&PTR__SigningProvider_01158df0;
      local_48 = !sign;
      local_47 = !bip32derivs;
      local_40 = pFVar5;
      SignPSBTInput(&local_50,psbtx,index,txdata,sighash_type,(SignatureData *)0x0,finalize);
      bVar3 = PSBTInputSigned(input);
      if ((n_signed != (int *)0x0) && (bVar3 || !sign)) {
        *n_signed = *n_signed + 1;
      }
    }
LAB_0096c992:
    index = index + 1;
  } while( true );
}

Assistant:

std::optional<PSBTError> LegacyScriptPubKeyMan::FillPSBT(PartiallySignedTransaction& psbtx, const PrecomputedTransactionData& txdata, int sighash_type, bool sign, bool bip32derivs, int* n_signed, bool finalize) const
{
    if (n_signed) {
        *n_signed = 0;
    }
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        const CTxIn& txin = psbtx.tx->vin[i];
        PSBTInput& input = psbtx.inputs.at(i);

        if (PSBTInputSigned(input)) {
            continue;
        }

        // Get the Sighash type
        if (sign && input.sighash_type != std::nullopt && *input.sighash_type != sighash_type) {
            return PSBTError::SIGHASH_MISMATCH;
        }

        // Check non_witness_utxo has specified prevout
        if (input.non_witness_utxo) {
            if (txin.prevout.n >= input.non_witness_utxo->vout.size()) {
                return PSBTError::MISSING_INPUTS;
            }
        } else if (input.witness_utxo.IsNull()) {
            // There's no UTXO so we can just skip this now
            continue;
        }
        SignPSBTInput(HidingSigningProvider(this, !sign, !bip32derivs), psbtx, i, &txdata, sighash_type, nullptr, finalize);

        bool signed_one = PSBTInputSigned(input);
        if (n_signed && (signed_one || !sign)) {
            // If sign is false, we assume that we _could_ sign if we get here. This
            // will never have false negatives; it is hard to tell under what i
            // circumstances it could have false positives.
            (*n_signed)++;
        }
    }

    // Fill in the bip32 keypaths and redeemscripts for the outputs so that hardware wallets can identify change
    for (unsigned int i = 0; i < psbtx.tx->vout.size(); ++i) {
        UpdatePSBTOutput(HidingSigningProvider(this, true, !bip32derivs), psbtx, i);
    }

    return {};
}